

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O0

int test_contexts_digest_or_legacy_mac(EVP_MD *type,int mac)

{
  int iVar1;
  EVP_MD_CTX *out;
  int in_ESI;
  EVP_MD *in_RDI;
  EVP_MD_CTX *copy;
  int i;
  uint tmplen;
  uint outlen;
  uchar c [64];
  uchar b [64];
  uchar pt [256];
  EVP_MD_CTX *save;
  EVP_MD_CTX *ctx;
  uchar K [32];
  int test;
  int ret;
  bool local_1e2;
  bool local_1e1;
  int local_1d4;
  uint local_1d0;
  uint local_1cc;
  size_t in_stack_fffffffffffffe38;
  void *in_stack_fffffffffffffe40;
  uchar local_188 [64];
  undefined1 local_148 [256];
  EVP_MD_CTX *local_48;
  EVP_MD_CTX *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  uint local_14;
  uint local_10;
  int local_c;
  EVP_MD *local_8;
  
  local_10 = 0;
  local_14 = 0;
  local_38 = 1;
  local_30 = 0;
  local_28 = 0;
  local_20 = 0;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_148,0,0x100);
  local_148[0] = 1;
  memset(local_188,0,0x40);
  local_40 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (local_40 == (EVP_MD_CTX *)0x0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_MD_CTX_new()",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0xae);
  }
  iVar1 = EVP_DigestInit_ex(local_40,local_8,(ENGINE *)0x0);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestInit_ex(ctx, type, NULL)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0xaf);
  }
  if ((local_c != 0) && (iVar1 = EVP_MD_CTX_ctrl(local_40,0x1004,0x20,&local_38), iVar1 == 0)) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0xb1);
  }
  iVar1 = EVP_DigestUpdate(local_40,local_148,0x100);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestUpdate(ctx, pt, sizeof(pt))",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0xb2);
  }
  iVar1 = EVP_DigestFinal_ex(local_40,local_188,&local_1d0);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestFinal_ex(ctx, b, &tmplen)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0xb3);
  }
  local_48 = local_40;
  EVP_MD_CTX_reset(local_40);
  EVP_MD_CTX_reset(local_40);
  iVar1 = EVP_DigestInit_ex(local_40,local_8,(ENGINE *)0x0);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestInit_ex(ctx, type, NULL)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0xb9);
  }
  if ((local_c != 0) && (iVar1 = EVP_MD_CTX_ctrl(local_40,0x1004,0x20,&local_38), iVar1 == 0)) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0xbb);
  }
  printf(" cloned contexts: ");
  memset(&stack0xfffffffffffffe38,0,0x40);
  for (local_1d4 = 0; local_1d4 < 0x10; local_1d4 = local_1d4 + 1) {
    out = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (out == (EVP_MD_CTX *)0x0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("copy = EVP_MD_CTX_new()",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                  ,0xc2);
    }
    iVar1 = EVP_MD_CTX_copy_ex(out,local_40);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MD_CTX_copy_ex(copy, ctx)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                  ,0xc3);
    }
    if (local_48 != local_40) {
      EVP_MD_CTX_free(local_40);
    }
    local_40 = out;
    iVar1 = EVP_DigestUpdate(out,local_148 + (local_1d4 << 4),0x10);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_DigestUpdate(ctx, pt + STEP_SIZE * i, STEP_SIZE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                  ,0xca);
    }
  }
  local_1cc = local_1d4 << 4;
  iVar1 = EVP_DigestFinal_ex(local_40,&stack0xfffffffffffffe38,&local_1d0);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestFinal_ex(ctx, c, &tmplen)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0xcd);
  }
  local_1e1 = true;
  if (local_1cc == 0x100) {
    iVar1 = memcmp(&stack0xfffffffffffffe38,local_188,0x40);
    local_1e1 = iVar1 != 0;
  }
  local_14 = (uint)local_1e1;
  if (local_1e1 == false) {
    printf("\x1b[1;32m  Test passed\x1b[m\n");
  }
  else {
    printf("\x1b[1;31m  Test FAILED\x1b[m\n");
  }
  EVP_MD_CTX_free(local_40);
  if (local_14 != 0) {
    printf("  b[%d] = ",(ulong)local_1cc);
    hexdump(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    printf("  c[%d] = ",(ulong)local_1cc);
    hexdump(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  local_10 = local_14 | local_10;
  printf("    base context: ");
  memset(&stack0xfffffffffffffe38,0,0x40);
  iVar1 = EVP_DigestUpdate(local_48,local_148,0x100);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestUpdate(save, pt, sizeof(pt))",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0xdc);
  }
  iVar1 = EVP_DigestFinal_ex(local_48,&stack0xfffffffffffffe38,&local_1d0);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestFinal_ex(save, c, &tmplen)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0xdd);
  }
  local_1e2 = true;
  if (local_1cc == 0x100) {
    iVar1 = memcmp(&stack0xfffffffffffffe38,local_188,0x40);
    local_1e2 = iVar1 != 0;
  }
  local_14 = (uint)local_1e2;
  if (local_1e2 == false) {
    printf("\x1b[1;32m  Test passed\x1b[m\n");
  }
  else {
    printf("\x1b[1;31m  Test FAILED\x1b[m\n");
  }
  EVP_MD_CTX_free(local_48);
  if (local_14 != 0) {
    printf("  b[%d] = ",(ulong)local_1cc);
    hexdump(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    printf("  c[%d] = ",(ulong)local_1cc);
    hexdump(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  return local_14 | local_10;
}

Assistant:

static int test_contexts_digest_or_legacy_mac(const EVP_MD *type, int mac)
{
    int ret = 0, test = 0;
    unsigned char K[32] = {1};

    /* produce base digest */
    EVP_MD_CTX *ctx, *save;
    unsigned char pt[TEST_SIZE] = {1};
    unsigned char b[EVP_MAX_MD_SIZE] = {0};
    unsigned char c[EVP_MAX_MD_SIZE];
    unsigned int outlen, tmplen;

    /* Simply digest whole input. */
    T(ctx = EVP_MD_CTX_new());
    T(EVP_DigestInit_ex(ctx, type, NULL));
    if (mac)
	T(EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K));
    T(EVP_DigestUpdate(ctx, pt, sizeof(pt)));
    T(EVP_DigestFinal_ex(ctx, b, &tmplen));
    save = ctx; /* will be not freed while cloning */

    /* cloned digest */
    EVP_MD_CTX_reset(ctx); /* test double reset */
    EVP_MD_CTX_reset(ctx);
    T(EVP_DigestInit_ex(ctx, type, NULL));
    if (mac)
	T(EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K));
    printf(" cloned contexts: ");
    memset(c, 0, sizeof(c));
    int i;
    for (i = 0; i < TEST_SIZE / STEP_SIZE; i++) {
	/* Clone and continue digesting next part of input. */
	EVP_MD_CTX *copy;
	T(copy = EVP_MD_CTX_new());
	T(EVP_MD_CTX_copy_ex(copy, ctx));

	/* rolling */
	if (save != ctx)
	    EVP_MD_CTX_free(ctx);
	ctx = copy;

	T(EVP_DigestUpdate(ctx, pt + STEP_SIZE * i, STEP_SIZE));
    }
    outlen = i * STEP_SIZE;
    T(EVP_DigestFinal_ex(ctx, c, &tmplen));
    /* Should be same as the simple digest. */
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, EVP_MAX_MD_SIZE));
    EVP_MD_CTX_free(ctx);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    /* Resume original context, what if it's damaged? */
    printf("    base context: ");
    memset(c, 0, sizeof(c));
    T(EVP_DigestUpdate(save, pt, sizeof(pt)));
    T(EVP_DigestFinal_ex(save, c, &tmplen));
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, EVP_MAX_MD_SIZE));
    EVP_MD_CTX_free(save);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    return ret;
}